

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O3

string * __thiscall
Assimp::FBX::Util::EncodeBase64_abi_cxx11_
          (string *__return_storage_ptr__,Util *this,char *data,size_t length)

{
  ulong uVar1;
  long lVar2;
  size_t string_pos;
  ulong uVar3;
  ulong uVar4;
  Util *bytes;
  char finalBytes [4];
  char local_34 [4];
  
  uVar3 = (ulong)data / 3;
  uVar1 = (ulong)data % 3;
  uVar4 = (ulong)((long)(data + (uVar1 ^ 3)) * 4) / 3;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar4);
  if ((char *)0x2 < data) {
    string_pos = 0;
    bytes = this;
    do {
      EncodeByteBlock((char *)bytes,__return_storage_ptr__,string_pos);
      bytes = bytes + 3;
      string_pos = string_pos + 4;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  local_34[0] = '\0';
  local_34[1] = '\0';
  local_34[2] = '\0';
  local_34[3] = '\0';
  memcpy(local_34,this + ((long)data - uVar1),uVar1);
  EncodeByteBlock(local_34,__return_storage_ptr__,uVar4 - 4);
  uVar1 = ((uVar1 ^ 3) << 2) / 3;
  lVar2 = uVar1 + (uVar1 == 0);
  do {
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar4 - 1] = '=';
    uVar4 = uVar4 - 1;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeBase64(const char* data, size_t length)
{
    // calculate extra bytes needed to get a multiple of 3
    size_t extraBytes = 3 - length % 3;

    // number of base64 bytes
    size_t encodedBytes = 4 * (length + extraBytes) / 3;

    std::string encoded_string(encodedBytes, '=');

    // read blocks of 3 bytes
    for (size_t ib3 = 0; ib3 < length / 3; ib3++)
    {
        const size_t iByte = ib3 * 3;
        const size_t iEncodedByte = ib3 * 4;
        const char* currData = &data[iByte];

        EncodeByteBlock(currData, encoded_string, iEncodedByte);
    }

    // if size of data is not a multiple of 3, also encode the final bytes (and add zeros where needed)
    if (extraBytes > 0)
    {
        char finalBytes[4] = { 0,0,0,0 };
        memcpy(&finalBytes[0], &data[length - length % 3], length % 3);

        const size_t iEncodedByte = encodedBytes - 4;
        EncodeByteBlock(&finalBytes[0], encoded_string, iEncodedByte);

        // add '=' at the end
        for (size_t i = 0; i < 4 * extraBytes / 3; i++)
            encoded_string[encodedBytes - i - 1] = '=';
    }
    return encoded_string;
}